

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O3

void __thiscall
gmlc::networking::TcpAcceptor::TcpAcceptor(TcpAcceptor *this,io_context *io_context,uint16_t port)

{
  address local_38;
  
  (this->super_enable_shared_from_this<gmlc::networking::TcpAcceptor>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::TcpAcceptor>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.ipv6_address_.addr_.__in6_u.__u6_addr32[2] = 0;
  local_38.ipv6_address_._12_8_ = 0;
  local_38.type_ = ipv4;
  local_38.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  local_38.ipv6_address_.addr_.__in6_u.__u6_addr32[0] = 0;
  local_38.ipv6_address_.addr_.__in6_u.__u6_addr32[1] = 0;
  ::asio::ip::detail::endpoint::endpoint((endpoint *)&this->endpoint_,&local_38,port);
  local_38.type_ = (uint)((this->endpoint_).impl_.data_.base.sa_family != 2) * 8 + 2;
  ::asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
  basic_socket_acceptor<asio::io_context>(&this->acceptor_,io_context,&local_38);
  (this->logFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->logFunction)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->logFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->logFunction).super__Function_base._M_functor + 8) = 0;
  (this->errorCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->errorCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->errorCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->errorCall).super__Function_base._M_functor + 8) = 0;
  (this->acceptCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->acceptCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->acceptCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->acceptCall).super__Function_base._M_functor + 8) = 0;
  (this->state)._M_i = CONNECTED;
  (this->accepting).triggered._M_base._M_i = false;
  (this->accepting).activeLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->accepting).activeLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->accepting).activeLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->accepting).activeLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->accepting).activeLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->accepting).triggerLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->accepting).triggerLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->accepting).triggerLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->accepting).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->accepting).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->accepting).triggerLock.super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  std::condition_variable::condition_variable(&(this->accepting).cv_trigger);
  std::condition_variable::condition_variable(&(this->accepting).cv_active);
  return;
}

Assistant:

TcpAcceptor::TcpAcceptor(asio::io_context& io_context, uint16_t port) :
    endpoint_(asio::ip::address_v4::any(), port),
    acceptor_(io_context, endpoint_.protocol()),
    state(AcceptingStates::CONNECTED)
{
}